

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

wstring_view __thiscall mjs::rtrim(mjs *this,wstring_view s,version ver)

{
  const_reference pvVar1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar2;
  wstring_view wVar3;
  bool local_39;
  size_type local_38;
  size_t end_pos;
  undefined1 auStack_28 [4];
  version ver_local;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  _auStack_28 = this;
  local_38 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28);
  while( true ) {
    local_39 = false;
    if (local_38 != 0) {
      pvVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28,
                          local_38 - 1);
      local_39 = is_whitespace_or_line_terminator((char16_t)*pvVar1,(version)s._M_str);
    }
    if (local_39 == false) break;
    local_38 = local_38 - 1;
  }
  bVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28,0,local_38
                    );
  wVar3._M_len = bVar2._M_len;
  wVar3._M_str = bVar2._M_str;
  return wVar3;
}

Assistant:

std::wstring_view rtrim(std::wstring_view s, version ver) {
    size_t end_pos = s.length();
    while (end_pos && is_whitespace_or_line_terminator(s[end_pos-1], ver)) {
        --end_pos;
    }
    return s.substr(0, end_pos);
}